

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::Mock::UnregisterLocked(UntypedFunctionMockerBase *mocker)

{
  bool bVar1;
  size_type sVar2;
  MutexBase *unaff_retaddr;
  FunctionMockers *mockers;
  iterator it;
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  *in_stack_ffffffffffffffc8;
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  *in_stack_ffffffffffffffd0;
  _Self local_18;
  _Self local_10 [2];
  
  internal::MutexBase::AssertHeld(unaff_retaddr);
  anon_unknown_18::MockObjectRegistry::states
            ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    anon_unknown_18::MockObjectRegistry::states
              ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) {
      return;
    }
    std::
    _Rb_tree_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                  *)0x1429c6);
    sVar2 = std::
            set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
            ::erase((set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
                     *)in_stack_ffffffffffffffd0,(key_type *)in_stack_ffffffffffffffc8);
    if (sVar2 != 0) break;
    std::
    _Rb_tree_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                  *)in_stack_ffffffffffffffd0);
  }
  bVar1 = std::
          set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
          ::empty((set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
                   *)0x1429f2);
  if (!bVar1) {
    return;
  }
  anon_unknown_18::MockObjectRegistry::states
            ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  std::
  map<void_const*,testing::(anonymous_namespace)::MockObjectState,std::less<void_const*>,std::allocator<std::pair<void_const*const,testing::(anonymous_namespace)::MockObjectState>>>
  ::erase_abi_cxx11_(in_stack_ffffffffffffffd0,(iterator)local_10[0]._M_node);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();
  for (MockObjectRegistry::StateMap::iterator it =
           g_mock_object_registry.states().begin();
       it != g_mock_object_registry.states().end(); ++it) {
    FunctionMockers& mockers = it->second.function_mockers;
    if (mockers.erase(mocker) > 0) {
      // mocker was in mockers and has been just removed.
      if (mockers.empty()) {
        g_mock_object_registry.states().erase(it);
      }
      return;
    }
  }
}